

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O3

MppDevBatServ * __thiscall
MppDevServer::bat_server_get(MppDevServer *this,MppClientType client_type)

{
  int iVar1;
  MppDevBatServ *ptr;
  MppTimer pvVar2;
  pthread_mutex_t *ppVar3;
  char *fmt;
  pthread_mutexattr_t attr;
  char timer_name [32];
  pthread_mutexattr_t local_5c;
  char local_58 [40];
  
  pthread_mutex_lock((pthread_mutex_t *)this);
  ptr = this->mBatServer[client_type];
  if (ptr == (MppDevBatServ *)0x0) {
    ptr = (MppDevBatServ *)mpp_osal_calloc("bat_server_get",0x90);
    if (ptr == (MppDevBatServ *)0x0) {
      ptr = (MppDevBatServ *)0x0;
      _mpp_log_l(2,"mpp_server","mpp server failed to get bat server\n",(char *)0x0);
    }
    else {
      iVar1 = open(this->mServerName,0x80002);
      ptr->server_fd = iVar1;
      if (iVar1 < 0) {
        fmt = "mpp server get bat server failed to open device\n";
      }
      else {
        strof_client_type(client_type);
        snprintf(local_58,0x1f,"%s_bat");
        pvVar2 = mpp_timer_get(local_58);
        ptr->timer = pvVar2;
        if (pvVar2 != (MppTimer)0x0) {
          ppVar3 = (pthread_mutex_t *)operator_new(0x28);
          pthread_mutexattr_init(&local_5c);
          pthread_mutexattr_settype(&local_5c,1);
          pthread_mutex_init(ppVar3,&local_5c);
          pthread_mutexattr_destroy(&local_5c);
          ptr->lock = (Mutex *)ppVar3;
          mpp_timer_set_callback(ptr->timer,mpp_server_thread,ptr);
          mpp_timer_set_timing(ptr->timer,10,10);
          (ptr->session_list).next = &ptr->session_list;
          (ptr->session_list).prev = &ptr->session_list;
          (ptr->list_batch).next = &ptr->list_batch;
          (ptr->list_batch).prev = &ptr->list_batch;
          (ptr->list_batch_free).next = &ptr->list_batch_free;
          (ptr->list_batch_free).prev = &ptr->list_batch_free;
          (ptr->pending_task).next = &ptr->pending_task;
          (ptr->pending_task).prev = &ptr->pending_task;
          ptr->batch_pool = this->mBatchPool;
          ptr->max_task_in_batch = this->mMaxTaskInBatch;
          this->mBatServer[client_type] = ptr;
          goto LAB_0011f84b;
        }
        fmt = "mpp server get bat server failed to create timer\n";
      }
      _mpp_log_l(2,"mpp_server",fmt,(char *)0x0);
      if (ptr->timer != (MppTimer)0x0) {
        mpp_timer_put(ptr->timer);
        ptr->timer = (MppTimer)0x0;
      }
      if (-1 < ptr->server_fd) {
        close(ptr->server_fd);
        ptr->server_fd = -1;
      }
      ppVar3 = (pthread_mutex_t *)ptr->lock;
      if (ppVar3 != (pthread_mutex_t *)0x0) {
        pthread_mutex_destroy(ppVar3);
        operator_delete(ppVar3,0x28);
        ptr->lock = (Mutex *)0x0;
      }
      mpp_osal_free("bat_server_get",ptr);
      ptr = (MppDevBatServ *)0x0;
    }
  }
LAB_0011f84b:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return ptr;
}

Assistant:

MppDevBatServ *MppDevServer::bat_server_get(MppClientType client_type)
{
    MppDevBatServ *server = NULL;

    AutoMutex auto_lock(this);

    server = mBatServer[client_type];
    if (server)
        return server;

    server = mpp_calloc(MppDevBatServ, 1);
    if (NULL == server) {
        mpp_err("mpp server failed to get bat server\n");
        return NULL;
    }

    server->server_fd = open(mServerName, O_RDWR | O_CLOEXEC);
    if (server->server_fd < 0) {
        mpp_err("mpp server get bat server failed to open device\n");
        goto failed;
    }

    char timer_name[32];

    snprintf(timer_name, sizeof(timer_name) - 1, "%s_bat",
             strof_client_type(client_type));

    server->timer = mpp_timer_get(timer_name);
    if (NULL == server->timer) {
        mpp_err("mpp server get bat server failed to create timer\n");
        goto failed;
    }

    server->lock = new Mutex();
    if (NULL == server->lock) {
        mpp_err("mpp server get bat server failed to create mutex\n");
        goto failed;
    }

    mpp_timer_set_callback(server->timer, mpp_server_thread, server);
    /* 10ms */
    mpp_timer_set_timing(server->timer, 10, 10);

    INIT_LIST_HEAD(&server->session_list);
    INIT_LIST_HEAD(&server->list_batch);
    INIT_LIST_HEAD(&server->list_batch_free);
    INIT_LIST_HEAD(&server->pending_task);

    server->batch_pool = mBatchPool;
    server->max_task_in_batch = mMaxTaskInBatch;

    mBatServer[client_type] = server;
    return server;

failed:
    if (server) {
        if (server->timer) {
            mpp_timer_put(server->timer);
            server->timer = NULL;
        }

        if (server->server_fd >= 0) {
            close(server->server_fd);
            server->server_fd = -1;
        }
        if (server->lock) {
            delete server->lock;
            server->lock = NULL;
        }
    }
    MPP_FREE(server);
    return server;
}